

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O2

void s3add_fattr(char *a,char *v,int dup)

{
  int32 iVar1;
  char *pcVar2;
  long lVar3;
  
  iVar1 = n_attrib;
  lVar3 = (long)n_attrib;
  if (lVar3 != 0x80) {
    if (dup == 0) {
      attrib[lVar3] = a;
    }
    else {
      pcVar2 = strdup(a);
      attrib[lVar3] = pcVar2;
      v = strdup(v);
    }
    value[lVar3] = v;
    alloc[lVar3] = dup;
    n_attrib = iVar1 + 1;
    attrib[lVar3 + 1] = (char *)0x0;
    value[lVar3 + 1] = (char *)0x0;
    return;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
          ,0x73,"Too many file attributes, increase MAX_ATTRIB\n");
  exit(1);
}

Assistant:

void
s3add_fattr(char *a,
	    char *v,
	    int dup)
{

    if (n_attrib == MAX_ATTRIB) {
	E_FATAL("Too many file attributes, increase MAX_ATTRIB\n");
    }

    if (dup) {
	attrib[n_attrib] = strdup(a);
	value[n_attrib] = strdup(v);
    }
    else {
	attrib[n_attrib] = a;
	value[n_attrib] = v;
    }
    alloc[n_attrib] = dup;

    ++n_attrib;

    attrib[n_attrib] = NULL;
    value[n_attrib] = NULL;
}